

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECUPort.cc
# Opt level: O0

void SSM::ECUPort::configurePort(int *file)

{
  int iVar1;
  DeviceException *pDVar2;
  int *piVar3;
  char *pcVar4;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_85;
  allocator<char> local_71;
  string local_70;
  undefined1 local_4c [8];
  termios tty;
  int *file_local;
  
  tty._52_8_ = file;
  memset(local_4c,0,0x3c);
  iVar1 = tcgetattr(*(int *)tty._52_8_,(termios *)local_4c);
  if (iVar1 != 0) {
    local_85 = 1;
    pDVar2 = (DeviceException *)__cxa_allocate_exception(0x28);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar4,&local_71);
    DeviceException::DeviceException(pDVar2,&local_70);
    local_85 = 0;
    __cxa_throw(pDVar2,&DeviceException::typeinfo,DeviceException::~DeviceException);
  }
  tty.c_iflag = tty.c_iflag & 0x7ffffebf | 0x8b0;
  tty.c_oflag = tty.c_oflag & 0xffffffa4;
  local_4c._0_4_ = local_4c._0_4_ & 0xffffe214;
  tty.c_lflag._2_1_ = 0x14;
  tty.c_lflag._3_1_ = 0;
  local_4c._4_4_ = local_4c._4_4_ & 0xfffffffa;
  cfsetispeed((termios *)local_4c,0xc);
  iVar1 = tcsetattr(*(int *)tty._52_8_,0,(termios *)local_4c);
  if (iVar1 != 0) {
    pDVar2 = (DeviceException *)__cxa_allocate_exception(0x28);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,pcVar4,&local_a9);
    DeviceException::DeviceException(pDVar2,&local_a8);
    __cxa_throw(pDVar2,&DeviceException::typeinfo,DeviceException::~DeviceException);
  }
  return;
}

Assistant:

void ECUPort::configurePort(const int& file)
  {
    // Read in existing settings
    struct termios tty; memset(&tty, 0, sizeof tty);
    if(tcgetattr(file, &tty)) throw(DeviceException(strerror(errno)));

    // Modify settings
    tty.c_cflag &= ~PARENB;        // Clear parity bit: disable parity
    tty.c_cflag &= ~CSTOPB;        // Use one stop bit
    tty.c_cflag |= CS8;            // 8 bits per byte
    tty.c_cflag &= ~CRTSCTS;       // Disable RTS/CTS hardware flow control
    tty.c_cflag |= CREAD | CLOCAL; // Turn on READ & ignore ctrl lines (CLOCAL = 1)
    tty.c_lflag &= ~ICANON;        // Disable canonical mode
    tty.c_lflag &= ~ECHO;          // Disable echo
    tty.c_lflag &= ~ECHOE;         // Disable erasure
    tty.c_lflag &= ~ECHONL;        // Disable new-line echo
    tty.c_lflag &= ~ISIG;          // Disable INTR, QUIT and SUSP
    tty.c_iflag &= ~IXON;          // Turn off software flow control
    tty.c_iflag &= ~IXOFF;
    tty.c_iflag &= ~IXANY;
    tty.c_iflag &= ~IGNBRK;        // Don't handle incoming bytes, get raw data
    tty.c_iflag &= ~BRKINT;
    tty.c_iflag &= ~PARMRK;
    tty.c_iflag &= ~ISTRIP;
    tty.c_iflag &= ~INLCR;
    tty.c_iflag &= ~IGNCR;
    tty.c_iflag &= ~ICRNL;

    tty.c_cc[VTIME] = 20;     // Return as soon as any data is received,
    tty.c_cc[VMIN]  = 0;      // subject to timeout of 2s (20 deciseconds)
    tty.c_oflag &= ~OPOST;    // No special interpretation of output bytes
    tty.c_oflag &= ~ONLCR;    // Noconversion of newline to carriage return/line feed
    cfsetispeed(&tty, B4800); // Set Baud rate to 4800

    // Pass settings back to port
    if (tcsetattr(file, TCSANOW, &tty))
      throw(DeviceException(strerror(errno)));
  }